

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicStdLayoutBase2VS::Run(BasicStdLayoutBase2VS *this)

{
  allocator<unsigned_char> *this_00;
  value_type vVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  GLuint GVar5;
  undefined4 extraout_var;
  size_type sVar6;
  reference pvVar7;
  byte *pbVar8;
  pointer *local_1f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_140;
  ulong local_130;
  size_t i_1;
  undefined1 local_120 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> out_data_1;
  int j;
  bool status;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out_data;
  GLuint i;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  char *local_80;
  char *glsl_vs;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in_data [4];
  BasicStdLayoutBase2VS *this_local;
  
  in_data[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  bVar3 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,8)
  ;
  if (bVar3) {
    local_140 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&glsl_vs;
    do {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_140);
      local_140 = local_140 + 1;
    } while (local_140 !=
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &in_data[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
    iVar4 = (*(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              _vptr_GLWrapper[9])(this,&glsl_vs);
    local_80 = (char *)CONCAT44(extraout_var,iVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,(char *)CONCAT44(extraout_var,iVar4),&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"",(allocator<char> *)((long)&i + 3));
    GVar5 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_b0,&local_d8);
    this->m_program = GVar5;
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    bVar3 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    if (bVar3) {
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,8,this->m_buffer);
      for (out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ < 4;
          out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        glu::CallLogWrapper::glBindBufferBase
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,
                   out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                   this->m_buffer
                   [out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_]);
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &in_data[(ulong)out_data.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_
                                    - 1].
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &in_data[(ulong)out_data.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_
                                     - 1].
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,0);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,sVar6,pvVar7,0x88e4);
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &in_data[(ulong)out_data.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_
                                    - 1].
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        this_00 = (allocator<unsigned_char> *)
                  ((long)&out_data_1.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 7);
        std::allocator<unsigned_char>::allocator(this_00);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&j,sVar6,this_00);
        std::allocator<unsigned_char>::~allocator
                  ((allocator<unsigned_char> *)
                   ((long)&out_data_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7));
        glu::CallLogWrapper::glBindBufferBase
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,
                   out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 4,
                   this->m_buffer
                   [out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 4]);
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &in_data[(ulong)out_data.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_
                                    - 1].
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&j,0);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,sVar6,pvVar7,0x88e4);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&j);
      }
      glu::CallLogWrapper::glGenVertexArrays
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_vertex_array);
      glu::CallLogWrapper::glEnable
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8c89);
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_vertex_array);
      glu::CallLogWrapper::glDrawArrays
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,0,1);
      out_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
      for (out_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          (int)out_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage < 4;
          out_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ =
               (int)out_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &in_data[(long)(int)out_data_1.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                    -1].
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&i_1 + 7));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_120,sVar6,
                   (allocator<unsigned_char> *)((long)&i_1 + 7));
        std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&i_1 + 7));
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,
                   this->m_buffer
                   [(int)out_data_1.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4]);
        glu::CallLogWrapper::glMemoryBarrier
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x200);
        sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &in_data[(long)(int)out_data_1.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                    -1].
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_120,0);
        glu::CallLogWrapper::glGetBufferSubData
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,0,sVar6,pvVar7);
        for (local_130 = 0;
            sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &in_data[(long)(int)out_data_1.
                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                        + -1].
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage),
            local_130 < sVar6; local_130 = local_130 + 1) {
          pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &in_data[(long)(int)out_data_1.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                       + -1].
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,local_130);
          vVar1 = *pvVar7;
          pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_120,
                              local_130);
          if (vVar1 != *pvVar7) {
            pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_120,
                                local_130);
            bVar2 = *pbVar8;
            pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                &in_data[(long)(int)out_data_1.
                                                                                                        
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                         + -1].
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,local_130);
            anon_unknown_0::Output
                      ("Byte at index %3d is %2x should be %2x.\n",local_130 & 0xffffffff,
                       (ulong)bVar2,(ulong)*pbVar8);
            out_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
          }
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_120);
      }
      if ((out_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) {
        this_local = (BasicStdLayoutBase2VS *)&DAT_ffffffffffffffff;
      }
      else {
        this_local = (BasicStdLayoutBase2VS *)0x0;
      }
    }
    else {
      this_local = (BasicStdLayoutBase2VS *)&DAT_ffffffffffffffff;
    }
    local_1f0 = &in_data[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      local_1f0 = local_1f0 + -3;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1f0);
    } while (local_1f0 != (pointer *)&glsl_vs);
  }
  else {
    this_local = (BasicStdLayoutBase2VS *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(8))
			return NOT_SUPPORTED;
		std::vector<GLubyte> in_data[4];
		const char*			 glsl_vs = GetInput(in_data);

		m_program = CreateProgram(glsl_vs, "");
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(8, m_buffer);

		for (GLuint i = 0; i < 4; ++i)
		{
			// input buffers
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_buffer[i]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data[i].size(), &in_data[i][0], GL_STATIC_DRAW);

			// output buffers
			std::vector<GLubyte> out_data(in_data[i].size());
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i + 4, m_buffer[i + 4]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data[i].size(), &out_data[0], GL_STATIC_DRAW);
		}

		glGenVertexArrays(1, &m_vertex_array);
		glEnable(GL_RASTERIZER_DISCARD);

		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glDrawArrays(GL_POINTS, 0, 1);

		bool status = true;
		for (int j = 0; j < 4; ++j)
		{
			std::vector<GLubyte> out_data(in_data[j].size());
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer[j + 4]);
			glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)in_data[j].size(), &out_data[0]);

			for (size_t i = 0; i < in_data[j].size(); ++i)
			{
				if (in_data[j][i] != out_data[i])
				{
					Output("Byte at index %3d is %2x should be %2x.\n", static_cast<int>(i), out_data[i],
						   in_data[j][i]);
					status = false;
				}
			}
		}
		if (!status)
			return ERROR;
		return NO_ERROR;
	}